

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpParser.cpp
# Opt level: O0

void __thiscall GrpParser::featureSpecList(GrpParser *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  long *in_RDI;
  GrpParser *in_stack_00000060;
  ParserException *ex;
  RefAST tmp157_AST;
  RefAST tmp156_AST;
  RefAST featureSpecList_AST;
  ASTPair currentAST;
  GrpParser *in_stack_00000320;
  ASTPair *in_stack_fffffffffffffe40;
  BitSet *in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  RefCount<AST> *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  ASTFactory *in_stack_fffffffffffffe78;
  int t;
  Parser *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe8c;
  int in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  int in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  int in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  undefined1 local_b8 [15];
  undefined1 local_a9;
  undefined1 local_a8 [8];
  undefined1 local_a0 [31];
  undefined1 local_81;
  undefined1 local_80 [16];
  undefined1 local_70 [39];
  undefined1 local_49;
  undefined1 local_48 [56];
  GrpParser *in_stack_fffffffffffffff0;
  
  RefCount<AST>::operator=
            ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
             in_stack_fffffffffffffe58);
  ASTPair::ASTPair((ASTPair *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
  RefCount<AST>::RefCount
            ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
             (RefCount<AST> *)in_stack_fffffffffffffe48);
  iVar2 = (**(code **)(*in_RDI + 0x20))(in_RDI,1);
  if (((iVar2 == 0xd) || (iVar2 = (**(code **)(*in_RDI + 0x20))(in_RDI,1), iVar2 == 0x10)) &&
     (iVar2 = (**(code **)(*in_RDI + 0x20))(in_RDI,2), iVar2 == 0xb)) {
    featureSpecStruct(in_stack_00000060);
    RefCount<AST>::RefCount
              ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
               (RefCount<AST> *)in_stack_fffffffffffffe48);
    ASTFactory::addASTChild
              ((ASTFactory *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
               (ASTPair *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
               (RefAST *)in_stack_fffffffffffffe80);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffe40->root);
    iVar2 = (**(code **)(*in_RDI + 0x20))(in_RDI,1);
    if ((((iVar2 == 0xd) || (iVar2 = (**(code **)(*in_RDI + 0x20))(in_RDI,1), iVar2 == 0x10)) ||
        (iVar2 = (**(code **)(*in_RDI + 0x20))(in_RDI,1), iVar2 == 0x11)) &&
       (((iVar2 = (**(code **)(*in_RDI + 0x20))(in_RDI,2), iVar2 == 4 ||
         (iVar2 = (**(code **)(*in_RDI + 0x20))(in_RDI,2), iVar2 == 0xb)) ||
        (iVar2 = (**(code **)(*in_RDI + 0x20))(in_RDI,2), iVar2 == 0x12)))) {
      (**(code **)(*in_RDI + 0x20))(in_RDI,3);
      bVar1 = BitSet::member(in_stack_fffffffffffffe48,
                             (int)((ulong)in_stack_fffffffffffffe40 >> 0x20));
      if (bVar1) {
        featureSpecList(in_stack_fffffffffffffff0);
        RefCount<AST>::RefCount
                  ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                   (RefCount<AST> *)in_stack_fffffffffffffe48);
        ASTFactory::addASTChild
                  ((ASTFactory *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                   (ASTPair *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                   (RefAST *)in_stack_fffffffffffffe80);
        RefCount<AST>::~RefCount(&in_stack_fffffffffffffe40->root);
        goto LAB_00201064;
      }
    }
    (**(code **)(*in_RDI + 0x20))(in_RDI,1);
    bVar1 = BitSet::member(in_stack_fffffffffffffe48,(int)((ulong)in_stack_fffffffffffffe40 >> 0x20)
                          );
    if (bVar1) {
      (**(code **)(*in_RDI + 0x20))(in_RDI,2);
      bVar1 = BitSet::member(in_stack_fffffffffffffe48,
                             (int)((ulong)in_stack_fffffffffffffe40 >> 0x20));
      if (bVar1) {
        (**(code **)(*in_RDI + 0x20))(in_RDI,3);
        bVar1 = BitSet::member(in_stack_fffffffffffffe48,
                               (int)((ulong)in_stack_fffffffffffffe40 >> 0x20));
        if (bVar1) goto LAB_00201064;
      }
    }
    local_49 = 1;
    uVar4 = __cxa_allocate_exception(0x40);
    (**(code **)(*in_RDI + 0x28))(local_48,in_RDI,1);
    NoViableAltException::NoViableAltException
              ((NoViableAltException *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0)
               ,(RefToken *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    local_49 = 0;
    __cxa_throw(uVar4,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException);
  }
  iVar2 = (**(code **)(*in_RDI + 0x20))(in_RDI,1);
  if ((((iVar2 != 0xd) &&
       (in_stack_fffffffffffffec0 = (**(code **)(*in_RDI + 0x20))(in_RDI,1),
       in_stack_fffffffffffffec0 != 0x10)) &&
      (in_stack_fffffffffffffebc = (**(code **)(*in_RDI + 0x20))(in_RDI,1),
      in_stack_fffffffffffffebc != 0x11)) ||
     ((in_stack_fffffffffffffeb8 = (**(code **)(*in_RDI + 0x20))(in_RDI,2),
      in_stack_fffffffffffffeb8 != 4 &&
      (iVar3 = (**(code **)(*in_RDI + 0x20))(in_RDI,2), iVar3 != 0x12)))) {
    uVar4 = __cxa_allocate_exception(0x40);
    (**(code **)(*in_RDI + 0x28))(local_b8,in_RDI,1);
    NoViableAltException::NoViableAltException
              ((NoViableAltException *)CONCAT44(iVar2,in_stack_fffffffffffffec0),
               (RefToken *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    __cxa_throw(uVar4,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException);
  }
  featureSpecFlat(in_stack_00000320);
  RefCount<AST>::RefCount
            ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
             (RefCount<AST> *)in_stack_fffffffffffffe48);
  ASTFactory::addASTChild
            ((ASTFactory *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
             (ASTPair *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
             (RefAST *)in_stack_fffffffffffffe80);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffe40->root);
  iVar3 = (**(code **)(*in_RDI + 0x20))(in_RDI,1);
  if ((iVar3 == 8) &&
     ((((iVar3 = (**(code **)(*in_RDI + 0x20))(in_RDI,2), iVar3 == 0xd ||
        (iVar3 = (**(code **)(*in_RDI + 0x20))(in_RDI,2), iVar3 == 0x10)) ||
       (iVar3 = (**(code **)(*in_RDI + 0x20))(in_RDI,2), iVar3 == 0x11)) &&
      (((iVar3 = (**(code **)(*in_RDI + 0x20))(in_RDI,3), iVar3 == 4 ||
        (in_stack_fffffffffffffe90 = (**(code **)(*in_RDI + 0x20))(in_RDI,3),
        in_stack_fffffffffffffe90 == 0xb)) ||
       (in_stack_fffffffffffffe8c = (**(code **)(*in_RDI + 0x20))(in_RDI,3),
       in_stack_fffffffffffffe8c == 0x12)))))) {
    RefCount<AST>::RefCount
              ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
               (RefCount<AST> *)in_stack_fffffffffffffe48);
    in_stack_fffffffffffffe80 = (Parser *)(in_RDI + 6);
    (**(code **)(*in_RDI + 0x28))(local_70,in_RDI,1);
    ASTFactory::create(in_stack_fffffffffffffe78,
                       (RefToken *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
    t = (int)((ulong)in_stack_fffffffffffffe78 >> 0x20);
    RefCount<AST>::operator=
              ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
               in_stack_fffffffffffffe58);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffe40->root);
    RefCount<Token>::~RefCount
              ((RefCount<Token> *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
    Parser::match(in_stack_fffffffffffffe80,t);
    featureSpecList(in_stack_fffffffffffffff0);
    in_stack_fffffffffffffe78 = (ASTFactory *)(in_RDI + 6);
    RefCount<AST>::RefCount
              ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
               (RefCount<AST> *)in_stack_fffffffffffffe48);
    ASTFactory::addASTChild
              ((ASTFactory *)CONCAT44(iVar3,in_stack_fffffffffffffe90),
               (ASTPair *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
               (RefAST *)in_stack_fffffffffffffe80);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffe40->root);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffe40->root);
  }
  else {
    in_stack_fffffffffffffe74 = (**(code **)(*in_RDI + 0x20))(in_RDI,1);
    bVar1 = BitSet::member(in_stack_fffffffffffffe48,(int)((ulong)in_stack_fffffffffffffe40 >> 0x20)
                          );
    in_stack_fffffffffffffe70 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe70);
    if (!bVar1) {
LAB_00200c34:
      local_81 = 1;
      uVar4 = __cxa_allocate_exception(0x40);
      (**(code **)(*in_RDI + 0x28))(local_80,in_RDI,1);
      NoViableAltException::NoViableAltException
                ((NoViableAltException *)CONCAT44(iVar2,in_stack_fffffffffffffec0),
                 (RefToken *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      local_81 = 0;
      __cxa_throw(uVar4,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException)
      ;
    }
    (**(code **)(*in_RDI + 0x20))(in_RDI,2);
    bVar1 = BitSet::member(in_stack_fffffffffffffe48,(int)((ulong)in_stack_fffffffffffffe40 >> 0x20)
                          );
    if (!bVar1) goto LAB_00200c34;
    in_stack_fffffffffffffe64 = (**(code **)(*in_RDI + 0x20))(in_RDI,3);
    bVar1 = BitSet::member(in_stack_fffffffffffffe48,(int)((ulong)in_stack_fffffffffffffe40 >> 0x20)
                          );
    in_stack_fffffffffffffe60 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe60);
    if (!bVar1) goto LAB_00200c34;
  }
  iVar3 = (**(code **)(*in_RDI + 0x20))(in_RDI,1);
  if (iVar3 == 8) {
    RefCount<AST>::RefCount
              ((RefCount<AST> *)CONCAT44(8,in_stack_fffffffffffffe50),
               (RefCount<AST> *)in_stack_fffffffffffffe48);
    (**(code **)(*in_RDI + 0x28))(local_a0,in_RDI,1);
    ASTFactory::create(in_stack_fffffffffffffe78,
                       (RefToken *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
    iVar2 = (int)((ulong)in_stack_fffffffffffffe78 >> 0x20);
    RefCount<AST>::operator=
              ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
               in_stack_fffffffffffffe58);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffe40->root);
    RefCount<Token>::~RefCount((RefCount<Token> *)CONCAT44(iVar3,in_stack_fffffffffffffe50));
    Parser::match(in_stack_fffffffffffffe80,iVar2);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffe40->root);
  }
  else if ((1 < iVar3 - 9U) && (5 < iVar3 - 0xcU)) {
    local_a9 = 1;
    uVar4 = __cxa_allocate_exception(0x40);
    (**(code **)(*in_RDI + 0x28))(local_a8,in_RDI,1);
    NoViableAltException::NoViableAltException
              ((NoViableAltException *)CONCAT44(iVar2,in_stack_fffffffffffffec0),
               (RefToken *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    local_a9 = 0;
    __cxa_throw(uVar4,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException);
  }
LAB_00201064:
  RefCount<AST>::operator=
            ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
             in_stack_fffffffffffffe58);
  RefCount<AST>::operator=
            ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
             in_stack_fffffffffffffe58);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffe40->root);
  ASTPair::~ASTPair(in_stack_fffffffffffffe40);
  return;
}

Assistant:

void GrpParser::featureSpecList() {
	
	returnAST = nullAST;
	ASTPair currentAST;
	RefAST featureSpecList_AST = nullAST;
	
	try {      // for error handling
		{
		if ((LA(1)==IDENT||LA(1)==LITERAL_name) && (LA(2)==OP_LBRACE)) {
			featureSpecStruct();
			astFactory.addASTChild(currentAST, returnAST);
			{
			if ((LA(1)==IDENT||LA(1)==LITERAL_name||LA(1)==LIT_INT) && (LA(2)==OP_EQ||LA(2)==OP_LBRACE||LA(2)==OP_DOT) && (_tokenSet_41.member(LA(3)))) {
				featureSpecList();
				astFactory.addASTChild(currentAST, returnAST);
			}
			else if ((_tokenSet_42.member(LA(1))) && (_tokenSet_4.member(LA(2))) && (_tokenSet_4.member(LA(3)))) {
			}
			else {
				throw NoViableAltException(LT(1));
			}
			
			}
		}
		else if ((LA(1)==IDENT||LA(1)==LITERAL_name||LA(1)==LIT_INT) && (LA(2)==OP_EQ||LA(2)==OP_DOT)) {
			featureSpecFlat();
			astFactory.addASTChild(currentAST, returnAST);
			{
			if ((LA(1)==OP_SEMI) && (LA(2)==IDENT||LA(2)==LITERAL_name||LA(2)==LIT_INT) && (LA(3)==OP_EQ||LA(3)==OP_LBRACE||LA(3)==OP_DOT)) {
				RefAST tmp156_AST = nullAST;
				tmp156_AST = astFactory.create(LT(1));
				match(OP_SEMI);
				featureSpecList();
				astFactory.addASTChild(currentAST, returnAST);
			}
			else if ((_tokenSet_43.member(LA(1))) && (_tokenSet_4.member(LA(2))) && (_tokenSet_4.member(LA(3)))) {
			}
			else {
				throw NoViableAltException(LT(1));
			}
			
			}
			{
			switch ( LA(1)) {
			case OP_SEMI:
			{
				RefAST tmp157_AST = nullAST;
				tmp157_AST = astFactory.create(LT(1));
				match(OP_SEMI);
				break;
			}
			case LITERAL_environment:
			case LITERAL_endenvironment:
			case OP_RBRACE:
			case IDENT:
			case LITERAL_table:
			case LITERAL_endtable:
			case LITERAL_name:
			case LIT_INT:
			{
				break;
			}
			default:
			{
				throw NoViableAltException(LT(1));
			}
			}
			}
		}
		else {
			throw NoViableAltException(LT(1));
		}
		
		}
		featureSpecList_AST = currentAST.root;
	}
	catch (ParserException& ex) {
		reportError(ex);
		consume();
		consumeUntil(_tokenSet_42);
	}
	returnAST = featureSpecList_AST;
}